

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O0

bool __thiscall ConfigReader::parseGrid(ConfigReader *this)

{
  double dVar1;
  invalid_argument *ia;
  double gd;
  string local_b8;
  undefined4 local_98;
  allocator<char> local_91;
  string local_90;
  token_t local_5c;
  undefined1 local_58 [4];
  token_t tok;
  string g;
  string tokstr;
  ConfigReader *this_local;
  
  std::__cxx11::string::string((string *)(g.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  local_5c = tokenize(this,(string *)local_58);
  if (local_5c == TOK_NUMBER) {
    local_5c = tokenize(this,(string *)((long)&g.field_2 + 8));
    if (local_5c == TOK_SEMICOL) {
      dVar1 = std::__cxx11::stod((string *)local_58,(size_t *)0x0);
      (*this->_vptr_ConfigReader[5])(dVar1);
      this_local._7_1_ = true;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Expected ;\n",(allocator<char> *)((long)&gd + 7));
      error(this,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gd + 7));
      this_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Expected a number for grid spacing\n",&local_91);
    error(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    this_local._7_1_ = false;
  }
  local_98 = 1;
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(g.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool ConfigReader::parseGrid()
{
    // GRID: g 
    std::string tokstr;
    std::string g;

    // grid
    ConfigReader::token_t tok = tokenize(g);
    if (tok != TOK_NUMBER)
    {
        error("Expected a number for grid spacing\n");
        return false;
    }

    // expect semicol
    tok = tokenize(tokstr);
    if (tok != TOK_SEMICOL)
    {
        error("Expected ;\n");
        return false;
    }

    double gd;
    try
    {
        gd = std::stod(g);
    }
    catch(const std::invalid_argument& ia)
    {
        error(ia.what());
    }

    onGrid(gd);
    return true;
}